

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::setAddress(QHostAddress *this,sockaddr *sockaddr)

{
  QHostAddress *in_RSI;
  quint8 *in_RDI;
  
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(&in_RSI->d);
  clear(in_RSI);
  if (*(short *)&(in_RSI->d).d.ptr == 2) {
    htonl(*(uint32_t *)((long)&(in_RSI->d).d.ptr + 4));
    setAddress(in_RSI,(quint32)((ulong)in_RDI >> 0x20));
  }
  else if (*(short *)&(in_RSI->d).d.ptr == 10) {
    setAddress(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void QHostAddress::setAddress(const struct sockaddr *sockaddr)
{
    d.detach();
    clear();
    if (sockaddr->sa_family == AF_INET)
        setAddress(htonl(((const sockaddr_in *)sockaddr)->sin_addr.s_addr));
    else if (sockaddr->sa_family == AF_INET6)
        setAddress(((const sockaddr_in6 *)sockaddr)->sin6_addr.s6_addr);
}